

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O1

void __thiscall fmp4_stream::trun::parse(trun *this,char *ptr)

{
  pointer *ppsVar1;
  iterator __position;
  uint uVar2;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  sample_entry ent;
  sample_entry local_50;
  uint uVar3;
  
  box::parse((box *)this,ptr);
  uVar5 = (ulong)((uint)(this->super_full_box).super_box.has_uuid_ * 0x10 +
                 (uint)(this->super_full_box).super_box.is_large_ * 8);
  uVar6 = *(uint *)(ptr + uVar5 + 8);
  (this->super_full_box).magic_conf_ =
       uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  (this->super_full_box).super_box.field_0x62 = ptr[uVar5 + 8];
  uVar6 = *(uint *)(ptr + uVar5 + 8);
  uVar2 = uVar6 >> 0x18;
  uVar3 = uVar2 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8;
  *(uint *)&(this->super_full_box).super_box.field_0x64 = uVar3;
  uVar4 = *(uint *)(ptr + 0xc);
  *(uint *)&(this->super_full_box).field_0x6c =
       uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  this->data_offset_present_ = SUB41(uVar2 & 1,0);
  this->first_sample_flags_present_ = SUB41((uVar2 & 4) >> 2,0);
  this->sample_duration_present_ = (bool)((byte)((uVar6 & 0xff0000) >> 0x10) & 1);
  this->sample_size_present_ = (bool)((byte)(uVar3 >> 9) & 1);
  this->sample_flags_present_ = (bool)((byte)(uVar3 >> 10) & 1);
  this->sample_composition_time_offsets_present_ = (bool)((byte)(uVar3 >> 0xb) & 1);
  uVar5 = 0x10;
  if ((uVar2 & 1) != 0) {
    uVar6 = *(uint *)(ptr + 0x10);
    this->data_offset_ =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    uVar5 = 0x14;
  }
  if ((uVar2 & 4) != 0) {
    uVar6 = *(uint *)(ptr + uVar5);
    this->first_sample_flags_ =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    uVar5 = (ulong)((int)uVar5 + 4);
  }
  if (*(int *)&(this->super_full_box).field_0x6c != 0) {
    uVar6 = 0;
    do {
      local_50._vptr_sample_entry = (_func_int **)&PTR_print_00197a98;
      local_50.sample_duration_ = 0;
      local_50.sample_size_ = 0;
      local_50.sample_flags_ = 0;
      local_50.sample_composition_time_offset_v0_ = 0;
      local_50.sample_composition_time_offset_v1_ = 0;
      if (this->sample_duration_present_ == true) {
        uVar4 = *(uint *)(ptr + uVar5);
        local_50.sample_size_ = 0;
        local_50.sample_duration_ =
             uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        uVar5 = (ulong)((int)uVar5 + 4);
      }
      if (this->sample_size_present_ == true) {
        uVar4 = *(uint *)(ptr + uVar5);
        local_50.sample_size_ =
             uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        uVar5 = (ulong)((int)uVar5 + 4);
      }
      if (this->sample_flags_present_ == true) {
        uVar4 = *(uint *)(ptr + uVar5);
        local_50.sample_composition_time_offset_v0_ = 0;
        local_50.sample_flags_ =
             uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        uVar5 = (ulong)((int)uVar5 + 4);
      }
      if (this->sample_composition_time_offsets_present_ == true) {
        uVar4 = *(uint *)(ptr + uVar5);
        uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        if ((this->super_full_box).super_box.field_0x62 == '\0') {
          local_50.sample_composition_time_offset_v0_ = uVar4;
          uVar4 = local_50.sample_composition_time_offset_v1_;
        }
        local_50.sample_composition_time_offset_v1_ = uVar4;
        uVar5 = (ulong)((int)uVar5 + 4);
      }
      __position._M_current =
           (this->m_sentry).
           super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_sentry).
          super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<fmp4_stream::trun::sample_entry,std::allocator<fmp4_stream::trun::sample_entry>>
        ::_M_realloc_insert<fmp4_stream::trun::sample_entry_const&>
                  ((vector<fmp4_stream::trun::sample_entry,std::allocator<fmp4_stream::trun::sample_entry>>
                    *)&this->m_sentry,__position,&local_50);
      }
      else {
        (__position._M_current)->_vptr_sample_entry = (_func_int **)&PTR_print_00197a98;
        (__position._M_current)->sample_duration_ = local_50.sample_duration_;
        (__position._M_current)->sample_size_ = local_50.sample_size_;
        (__position._M_current)->sample_flags_ = local_50.sample_flags_;
        (__position._M_current)->sample_composition_time_offset_v0_ =
             local_50.sample_composition_time_offset_v0_;
        (__position._M_current)->sample_composition_time_offset_v1_ =
             local_50.sample_composition_time_offset_v1_;
        ppsVar1 = &(this->m_sentry).
                   super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppsVar1 = *ppsVar1 + 1;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < *(uint *)&(this->super_full_box).field_0x6c);
  }
  return;
}

Assistant:

void trun::parse(const char * ptr)
	{
		full_box::parse(ptr);

		sample_count_ = fmp4_read_uint32(ptr + 12);

		std::bitset<32> bb(flags_);

		data_offset_present_ = bb[0];
		//cout << "data_offset_present " << data_offset_present << endl;
		first_sample_flags_present_ = bb[2];
		//cout << "first_sample_flags_present " << first_sample_flags_present << endl;
		sample_duration_present_ = bb[8];
		//cout << "sample_duration_present " << sample_duration_present << endl;
		sample_size_present_ = bb[9];
		//cout << "sample_size_present " << sample_size_present << endl;
		sample_flags_present_ = bb[10];
		sample_composition_time_offsets_present_ = bb[11];

		//sentry.resize(sample_count);
		unsigned int offset = 16;
		if (data_offset_present_)
		{
			this->data_offset_ = fmp4_read_uint32(ptr + offset);
			offset += 4;
		}if (first_sample_flags_present_) {
			this->first_sample_flags_ = fmp4_read_uint32(ptr + offset);
			offset += 4;
		}
		// write all the entries to the trun box
		for (unsigned int i = 0; i < sample_count_; i++)
		{
			sample_entry ent = {};
			if (sample_duration_present_)
			{
				ent.sample_duration_ = fmp4_read_uint32(ptr + offset);
				offset += 4;
			}
			if (sample_size_present_)
			{
				ent.sample_size_ = fmp4_read_uint32(ptr + offset);
				offset += 4;
			}
			if (sample_flags_present_)
			{
				ent.sample_flags_ = fmp4_read_uint32(ptr + offset);
				offset += 4;
			}
			if (sample_composition_time_offsets_present_)
			{
				if (version_ == 0)
					ent.sample_composition_time_offset_v0_ = fmp4_read_uint32(ptr + offset);
				else
					ent.sample_composition_time_offset_v1_ = fmp4_read_uint32(ptr + offset);
				offset += 4;
			}
			m_sentry.push_back(ent);
		}
	}